

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall Renderer::Render(Renderer *this,Snake *snake,Snake *snake2,SDL_Point *food)

{
  pointer pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  SDL_Point *point_1;
  pointer pSVar5;
  SDL_Point *point;
  SDL_Rect block;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_38 = (int)(this->screen_width / this->grid_width);
  local_34 = (int)(this->screen_height / this->grid_height);
  SDL_SetRenderDrawColor(this->sdl_renderer,0x1e,0x1e,0x1e,0xff);
  SDL_RenderClear(this->sdl_renderer);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xcc,0,0xff);
  local_40 = local_38 * food->x;
  local_3c = local_34 * food->y;
  SDL_RenderFillRect(this->sdl_renderer,&local_40);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff,0xff);
  pSVar5 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      local_40 = local_38 * pSVar5->x;
      local_3c = local_34 * pSVar5->y;
      SDL_RenderFillRect(this->sdl_renderer,&local_40);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  local_40 = (int)snake->head_x * local_38;
  local_3c = (int)snake->head_y * local_34;
  if (snake->alive == false) {
    uVar4 = 0xff;
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0x7a;
    uVar2 = 0xcc;
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,uVar4,uVar3,uVar2,0xff);
  SDL_RenderFillRect(this->sdl_renderer,&local_40);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff,0xff);
  pSVar5 = (snake2->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (snake2->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      local_40 = local_38 * pSVar5->x;
      local_3c = local_34 * pSVar5->y;
      SDL_RenderFillRect(this->sdl_renderer,&local_40);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  local_40 = (int)snake2->head_x * local_38;
  local_3c = (int)snake2->head_y * local_34;
  if (snake2->alive == false) {
    uVar4 = 0xff;
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0x7a;
    uVar2 = 0xcc;
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,uVar4,uVar3,uVar2,0xff);
  SDL_RenderFillRect(this->sdl_renderer,&local_40);
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render(Snake const snake, Snake const snake2, SDL_Point const &food) {
  SDL_Rect block;
  block.w = screen_width / grid_width;
  block.h = screen_height / grid_height;

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0x1E, 0x1E, 0x1E, 0xFF);
  SDL_RenderClear(sdl_renderer);

  // Render food
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xCC, 0x00, 0xFF);
  block.x = food.x * block.w;
  block.y = food.y * block.h;
  SDL_RenderFillRect(sdl_renderer, &block);

  // Render snake's body
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  for (SDL_Point const &point : snake.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake's head
  block.x = static_cast<int>(snake.head_x) * block.w;
  block.y = static_cast<int>(snake.head_y) * block.h;
  if (snake.alive) {
    SDL_SetRenderDrawColor(sdl_renderer, 0x00, 0x7A, 0xCC, 0xFF);
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
  }
  SDL_RenderFillRect(sdl_renderer, &block);
  
  // Render snake2's body
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  for (SDL_Point const &point : snake2.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake2's head
  block.x = static_cast<int>(snake2.head_x) * block.w;
  block.y = static_cast<int>(snake2.head_y) * block.h;
  if (snake2.alive) {
    SDL_SetRenderDrawColor(sdl_renderer, 0x00, 0x7A, 0xCC, 0xFF);
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
  }
  SDL_RenderFillRect(sdl_renderer, &block);
  
  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}